

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

void linenoise_completion(char *zLine,linenoiseCompletions *lc)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *zSql;
  uchar *__src;
  sqlite3 *db;
  ulong uVar7;
  size_t line_idx;
  long lVar8;
  sqlite3_stmt *pStmt;
  sqlite3 *localDb;
  char zBuf [1000];
  sqlite3_stmt *local_438;
  char *local_430;
  linenoiseCompletions *local_428;
  sqlite3 *local_420;
  byte local_418 [1000];
  
  local_430 = zLine;
  local_428 = lc;
  sVar6 = strlen(zLine);
  local_438 = (sqlite3_stmt *)0x0;
  if ((sVar6 < 0x3cb) && (*local_430 != '#')) {
    if (*local_430 == '.') {
      lVar8 = 0;
      do {
        pbVar2 = (byte *)azHelp[lVar8];
        if (*pbVar2 == 0x2e) {
          bVar1 = *pbVar2;
          iVar4 = isspace((uint)bVar1);
          if (bVar1 == 0) {
            uVar7 = 0;
          }
          else {
            uVar7 = 0;
            if (iVar4 == 0) {
              uVar7 = 0;
              while (uVar7 != 999) {
                local_418[uVar7] = bVar1;
                if ((uVar7 < sVar6) && (pbVar2[uVar7] != local_430[uVar7])) {
                  local_418[uVar7] = 0;
                  goto LAB_0021a4f7;
                }
                bVar1 = pbVar2[uVar7 + 1];
                iVar4 = isspace((uint)bVar1);
                uVar7 = uVar7 + 1;
                if ((bVar1 == 0) || (iVar4 != 0)) goto LAB_0021a4dd;
              }
              uVar7 = 999;
            }
          }
LAB_0021a4dd:
          local_418[uVar7] = 0;
          if (sVar6 <= uVar7) {
            linenoiseAddCompletion(local_428,(char *)local_418);
          }
        }
LAB_0021a4f7:
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x76);
    }
    else {
      zSql = duckdb_shell_sqlite3_mprintf("CALL sql_auto_complete(%Q)",local_430);
      local_420 = (sqlite3 *)0x0;
      db = globalDb;
      if (globalDb == (sqlite3 *)0x0) {
        duckdb_shell_sqlite3_open(":memory:",&local_420);
        db = local_420;
      }
      duckdb_shell_sqlite3_prepare_v2(db,zSql,-1,&local_438,(char **)0x0);
      duckdb_shell_sqlite3_free(zSql);
      iVar4 = duckdb_shell_sqlite3_step(local_438);
      if (iVar4 == 100) {
        bVar3 = false;
        do {
          __src = duckdb_shell_sqlite3_column_text(local_438,0);
          iVar4 = duckdb_shell_sqlite3_column_bytes(local_438,0);
          iVar5 = duckdb_shell_sqlite3_column_int(local_438,1);
          if (iVar5 + iVar4 < 999) {
            if (!bVar3) {
              switchD_00b1522a::default(local_418,local_430,(long)iVar5);
            }
            switchD_00b1522a::default(local_418 + iVar5,__src,(long)(iVar4 + 1));
            linenoiseAddCompletion(local_428,(char *)local_418);
            bVar3 = true;
          }
          iVar4 = duckdb_shell_sqlite3_step(local_438);
        } while (iVar4 == 100);
      }
      duckdb_shell_sqlite3_finalize(local_438);
      if (local_420 != (sqlite3 *)0x0) {
        duckdb_shell_sqlite3_close(local_420);
      }
    }
  }
  return;
}

Assistant:

static void linenoise_completion(const char *zLine, linenoiseCompletions *lc) {
	idx_t nLine = ShellState::StringLength(zLine);
	int copiedSuggestion = 0;
	sqlite3_stmt *pStmt = 0;
	char *zSql;
	char zBuf[1000];

	if (nLine > sizeof(zBuf) - 30) {
		return;
	}
	if (zLine[0] == '.') {
		// auto-complete dot command
		// look for all completions in the help file
		size_t line_idx;
		for (line_idx = 0; line_idx < ArraySize(azHelp); line_idx++) {
			const char *line = azHelp[line_idx];
			if (line[0] != '.') {
				continue;
			}
			int found_match = 1;
			size_t line_pos;
			for (line_pos = 0; !IsSpace(line[line_pos]) && line[line_pos] && line_pos + 1 < sizeof(zBuf); line_pos++) {
				zBuf[line_pos] = line[line_pos];
				if (line_pos < nLine && line[line_pos] != zLine[line_pos]) {
					// only match prefixes for auto-completion, i.e. ".sh" matches ".shell"
					found_match = 0;
					break;
				}
			}
			zBuf[line_pos] = '\0';
			if (found_match && line_pos >= nLine) {
				linenoiseAddCompletion(lc, zBuf);
			}
		}
		return;
	}
	if (zLine[0] == '#') {
		return;
	}
	//  if( i==nLine-1 ) return;
	zSql = sqlite3_mprintf("CALL sql_auto_complete(%Q)", zLine);
	sqlite3 *localDb = NULL;
	if (!globalDb) {
		sqlite3_open(":memory:", &localDb);
		sqlite3_prepare_v2(localDb, zSql, -1, &pStmt, 0);
	} else {
		sqlite3_prepare_v2(globalDb, zSql, -1, &pStmt, 0);
	}
	sqlite3_free(zSql);
	while (sqlite3_step(pStmt) == SQLITE_ROW) {
		const char *zCompletion = (const char *)sqlite3_column_text(pStmt, 0);
		int nCompletion = sqlite3_column_bytes(pStmt, 0);
		int iStart = sqlite3_column_int(pStmt, 1);
		if (iStart + nCompletion < int(sizeof(zBuf) - 1)) {
			if (!copiedSuggestion) {
				memcpy(zBuf, zLine, iStart);
				copiedSuggestion = 1;
			}
			memcpy(zBuf + iStart, zCompletion, nCompletion + 1);
			linenoiseAddCompletion(lc, zBuf);
		}
	}
	sqlite3_finalize(pStmt);
	if (localDb) {
		sqlite3_close(localDb);
	}
}